

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signals.c
# Opt level: O1

void setup_signals(sigaction *signal_action,int flags)

{
  signal_action->sa_flags = 0x10000000;
  sigemptyset((sigset_t *)&signal_action->sa_mask);
  setup_ignored_signals(signal_action,flags);
  sigemptyset((sigset_t *)&signal_action->sa_mask);
  setup_blocked_signals(signal_action,flags);
  return;
}

Assistant:

void setup_signals(struct sigaction *signal_action, int flags) {
	// Let system calls restart when it
	// was interrupted by a signal
	signal_action->sa_flags = SA_RESTART;

	// Clear all flags
	sigemptyset(&signal_action->sa_mask);

	setup_ignored_signals(signal_action, flags);

	// Clear all flags
	sigemptyset(&signal_action->sa_mask);

	setup_blocked_signals(signal_action, flags);
}